

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O2

char p_b_coll_elem(parse *p,int endc)

{
  char *__s2;
  char *__s1;
  int iVar1;
  char *pcVar2;
  size_t __n;
  
  __s2 = p->next;
  __n = 0;
  do {
    if (p->end <= __s2 + __n) {
      if (p->error == 0) {
        p->error = 7;
      }
LAB_0010561b:
      p->next = nuls;
      p->end = nuls;
      return '\0';
    }
    pcVar2 = __s2 + __n + 1;
    if (((pcVar2 < p->end) && (__s2[__n] == endc)) && (*pcVar2 == ']')) {
      for (pcVar2 = &cnames[0].code; __s1 = ((cname *)(pcVar2 + -8))->name, __s1 != (char *)0x0;
          pcVar2 = pcVar2 + 0x10) {
        iVar1 = strncmp(__s1,__s2,__n);
        if ((iVar1 == 0) && (__s1[__n] == '\0')) {
          return *pcVar2;
        }
      }
      if (__n == 1) {
        return *__s2;
      }
      if (p->error == 0) {
        p->error = 3;
      }
      goto LAB_0010561b;
    }
    p->next = pcVar2;
    __n = __n + 1;
  } while( true );
}

Assistant:

static char			/* value of collating element */
p_b_coll_elem(p, endc)
struct parse *p;
int endc;			/* name ended by endc,']' */
{
	char *sp = p->next;
	struct cname *cp;
	size_t len;

	while (MORE() && !SEETWO(endc, ']'))
		NEXT();
	if (!MORE()) {
		seterr(p, REG_EBRACK);
		return(0);
	}
	len = (size_t)(p->next - sp);
	for (cp = cnames; cp->name != NULL; cp++)
		if (strncmp(cp->name, sp, len) == 0 && cp->name[len] == '\0')
			return(cp->code);	/* known name */
	if (len == 1)
		return(*sp);	/* single character */
	seterr(p, REG_ECOLLATE);			/* neither */
	return(0);
}